

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_tests.cpp
# Opt level: O0

bool FilterTest(char *filter,STATE ranTestHoge,STATE ranHogeTest,STATE ranFooBar,STATE ranFooBaz,
               STATE ranFooBarTest,STATE ranFooQux)

{
  bool bVar1;
  UnitTestSource *this;
  iuStreamMessage *message;
  char *pcVar2;
  UnitTest *pUVar3;
  type **in_stack_ffffffffffffe768;
  AssertionHelper local_1720;
  Fixed local_16f0;
  int local_1568;
  char local_1564 [4];
  undefined1 local_1560 [8];
  AssertionResult iutest_ar_10;
  Fixed local_1508;
  int local_1380;
  char local_137c [4];
  undefined1 local_1378 [8];
  AssertionResult iutest_ar_9;
  Fixed local_1320;
  int local_1198;
  int local_1194;
  undefined1 local_1190 [8];
  AssertionResult iutest_ar_8;
  undefined1 local_1160 [4];
  int kTotal;
  Fixed local_1130;
  int local_fa8;
  char local_fa4 [4];
  undefined1 local_fa0 [8];
  AssertionResult iutest_ar_7;
  Fixed local_f48;
  int local_dbc;
  undefined1 local_db8 [8];
  AssertionResult iutest_ar_6;
  undefined1 local_d88 [4];
  int nRan;
  Fixed local_d58;
  undefined1 local_bd0 [8];
  AssertionResult iutest_ar_5;
  Fixed local_b78;
  undefined1 local_9f0 [8];
  AssertionResult iutest_ar_4;
  Fixed local_998;
  undefined1 local_810 [8];
  AssertionResult iutest_ar_3;
  Fixed local_7b8;
  undefined1 local_630 [8];
  AssertionResult iutest_ar_2;
  Fixed local_5d8;
  undefined1 local_450 [8];
  AssertionResult iutest_ar_1;
  Fixed local_3f8;
  undefined1 local_270 [8];
  AssertionResult iutest_ar;
  iuCodeMessage local_c0;
  undefined1 local_90 [8];
  ScopedMessage scoped_message_0;
  int ret;
  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> local_50;
  STATE local_2c;
  STATE local_28;
  STATE ranFooBarTest_local;
  STATE ranFooBaz_local;
  STATE ranFooBar_local;
  STATE ranHogeTest_local;
  STATE ranTestHoge_local;
  char *filter_local;
  
  TestHoge::state = 0;
  HogeTest::state = 0;
  FooBar::state = 0;
  FooBaz::state = 0;
  FooBarTest::state = 0;
  FooQux::state = 0;
  local_2c = ranFooBarTest;
  local_28 = ranFooBaz;
  ranFooBarTest_local = ranFooBar;
  ranFooBaz_local = ranHogeTest;
  ranFooBar_local = ranTestHoge;
  _ranHogeTest_local = filter;
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  OptionString(&local_50);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=(&local_50,filter);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  ~OptionString(&local_50);
  this = iutest::UnitTestSource::GetInstance();
  scoped_message_0.super_iuCodeMessage.m_line = iutest::UnitTestSource::Run(this);
  if (scoped_message_0.super_iuCodeMessage.m_line == 0) {
    iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&iutest_ar.m_result);
    message = iutest::detail::iuStreamMessage::operator<<
                        ((iuStreamMessage *)&iutest_ar.m_result,(char **)&ranHogeTest_local);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
               ,0x3b,message);
    iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_90,&local_c0);
    iutest::detail::iuCodeMessage::~iuCodeMessage(&local_c0);
    iutest::detail::iuStreamMessage::~iuStreamMessage((iuStreamMessage *)&iutest_ar.m_result);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::EqHelper<false>::Compare<TestHoge::STATE>
              ((AssertionResult *)local_270,"ranTestHoge","TestHoge::state",&ranFooBar_local,
               &TestHoge::state);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      memset(&local_3f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3f8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_270);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_1.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x3d,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_3f8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3f8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::EqHelper<false>::Compare<HogeTest::STATE>
              ((AssertionResult *)local_450,"ranHogeTest","HogeTest::state",&ranFooBaz_local,
               &HogeTest::state);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
    if (!bVar1) {
      memset(&local_5d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_450);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x3e,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_5d8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_450);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::EqHelper<false>::Compare<FooBar::STATE>
              ((AssertionResult *)local_630,"ranFooBar","FooBar::state",&ranFooBarTest_local,
               &FooBar::state);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
    if (!bVar1) {
      memset(&local_7b8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7b8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_630);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x3f,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_7b8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7b8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_630);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::EqHelper<false>::Compare<FooBaz::STATE>
              ((AssertionResult *)local_810,"ranFooBaz","FooBaz::state",&local_28,&FooBaz::state);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
    if (!bVar1) {
      memset(&local_998,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_998);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_810);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_4.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x40,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_998);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_998);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_810);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::EqHelper<false>::Compare<FooBarTest::STATE>
              ((AssertionResult *)local_9f0,"ranFooBarTest","FooBarTest::state",&local_2c,
               &FooBarTest::state);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
    if (!bVar1) {
      memset(&local_b78,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_b78);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9f0);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_5.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x41,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_b78);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_b78);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
    iutest::detail::AlwaysZero();
    iutest::internal::backward::EqHelper<false>::Compare<FooQux::STATE>
              ((AssertionResult *)local_bd0,"ranFooQux","FooQux::state",&ranFooQux,&FooQux::state);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
    if (!bVar1) {
      memset(&local_d58,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_d58);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bd0);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_d88,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x42,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_d88,&local_d58);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_d88);
      iutest::AssertionHelper::Fixed::~Fixed(&local_d58);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
    iutest_ar_6._37_3_ = 0;
    iutest_ar_6._36_1_ = ranFooBar_local != NOT_RAN;
    if (ranFooBaz_local != NOT_RAN) {
      iutest_ar_6._36_4_ = iutest_ar_6._36_4_ + 1;
    }
    if (ranFooBarTest_local != NOT_RAN) {
      iutest_ar_6._36_4_ = iutest_ar_6._36_4_ + 1;
    }
    if (local_28 != NOT_RAN) {
      iutest_ar_6._36_4_ = iutest_ar_6._36_4_ + 1;
    }
    if (local_2c != NOT_RAN) {
      iutest_ar_6._36_4_ = iutest_ar_6._36_4_ + 1;
    }
    if (ranFooQux != NOT_RAN) {
      iutest_ar_6._36_4_ = iutest_ar_6._36_4_ + 1;
    }
    iutest::detail::AlwaysZero();
    pUVar3 = iutest::UnitTest::GetInstance();
    local_dbc = iutest::UnitTest::reportable_test_count(pUVar3);
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_db8,"nRan",
               "::iutest::UnitTest::GetInstance()->reportable_test_count()",
               (int *)&iutest_ar_6.field_0x24,&local_dbc);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
    if (!bVar1) {
      memset(&local_f48,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_f48);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_db8);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_7.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x4e,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_7.m_result,&local_f48);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_7.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_f48);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
    iutest::detail::AlwaysZero();
    local_fa4[0] = '\0';
    local_fa4[1] = '\0';
    local_fa4[2] = '\0';
    local_fa4[3] = '\0';
    pUVar3 = iutest::UnitTest::GetInstance();
    local_fa8 = iutest::UnitTest::reportable_disabled_test_count(pUVar3);
    iutest::internal::backward::EqHelper<true>::Compare<int,int>
              ((AssertionResult *)local_fa0,(EqHelper<true> *)0x1534d0,
               "::iutest::UnitTest::GetInstance()->reportable_disabled_test_count()",local_fa4,
               &local_fa8,(int *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_ffffffffffffe768);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
    if (!bVar1) {
      memset(&local_1130,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1130);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_fa0);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_1160,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x4f,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_1160,&local_1130);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_1160);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1130);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
    iutest_ar_8._36_4_ = 6;
    iutest::detail::AlwaysZero();
    local_1194 = 6 - iutest_ar_6._36_4_;
    pUVar3 = iutest::UnitTest::GetInstance();
    local_1198 = iutest::UnitTest::skip_test_count(pUVar3);
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_1190,"kTotal-nRan",
               "::iutest::UnitTest::GetInstance()->skip_test_count()",&local_1194,&local_1198);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1190);
    if (!bVar1) {
      memset(&local_1320,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1320);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1190);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_9.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x53,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_9.m_result,&local_1320);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_9.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1320);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1190);
    iutest::detail::AlwaysZero();
    local_137c[0] = '\0';
    local_137c[1] = '\0';
    local_137c[2] = '\0';
    local_137c[3] = '\0';
    pUVar3 = iutest::UnitTest::GetInstance();
    local_1380 = iutest::UnitTest::reportable_skip_test_count(pUVar3);
    iutest::internal::backward::EqHelper<true>::Compare<int,int>
              ((AssertionResult *)local_1378,(EqHelper<true> *)0x1534d0,
               "::iutest::UnitTest::GetInstance()->reportable_skip_test_count()",local_137c,
               &local_1380,(int *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_ffffffffffffe768);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1378);
    if (!bVar1) {
      memset(&local_1508,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1508);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1378);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_10.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x54,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_10.m_result,&local_1508);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_10.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1508);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1378);
    iutest::detail::AlwaysZero();
    local_1564[0] = '\0';
    local_1564[1] = '\0';
    local_1564[2] = '\0';
    local_1564[3] = '\0';
    pUVar3 = iutest::UnitTest::GetInstance();
    local_1568 = iutest::UnitTest::reportable_test_run_skipped_count(pUVar3);
    iutest::internal::backward::EqHelper<true>::Compare<int,int>
              ((AssertionResult *)local_1560,(EqHelper<true> *)0x1534d0,
               "::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count()",local_1564,
               &local_1568,(int *)&iutest_type_traits::enabler_t<void>::value,
               in_stack_ffffffffffffe768);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1560);
    if (!bVar1) {
      memset(&local_16f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_16f0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1560);
      iutest::AssertionHelper::AssertionHelper
                (&local_1720,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x55,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_1720,&local_16f0);
      iutest::AssertionHelper::~AssertionHelper(&local_1720);
      iutest::AssertionHelper::Fixed::~Fixed(&local_16f0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1560);
    iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_90);
    pUVar3 = iutest::UnitTest::GetInstance();
    filter_local._7_1_ = iutest::UnitTest::Passed(pUVar3);
  }
  else {
    filter_local._7_1_ = false;
  }
  return filter_local._7_1_;
}

Assistant:

bool FilterTest(const char* filter
    , TestHoge::STATE ranTestHoge
    , HogeTest::STATE ranHogeTest
    , FooBar::STATE ranFooBar
    , FooBaz::STATE ranFooBaz
    , FooBarTest::STATE ranFooBarTest
    , FooQux::STATE ranFooQux
)
{
    TestHoge::state = TestHoge::NOT_RAN;
    HogeTest::state = HogeTest::NOT_RAN;
    FooBar::state = FooBar::NOT_RAN;
    FooBaz::state = FooBaz::NOT_RAN;
    FooBarTest::state = FooBarTest::NOT_RAN;
    FooQux::state = FooQux::NOT_RAN;

    ::iutest::IUTEST_FLAG(filter) = filter;
    const int ret = IUTEST_RUN_ALL_TESTS();
    if( ret != 0 ) return false;

    {
        IUTEST_SCOPED_TRACE(filter);

        IUTEST_EXPECT_EQ( ranTestHoge  , TestHoge::state );
        IUTEST_EXPECT_EQ( ranHogeTest  , HogeTest::state );
        IUTEST_EXPECT_EQ( ranFooBar    , FooBar::state );
        IUTEST_EXPECT_EQ( ranFooBaz    , FooBaz::state );
        IUTEST_EXPECT_EQ( ranFooBarTest, FooBarTest::state );
        IUTEST_EXPECT_EQ( ranFooQux    , FooQux::state );

        int nRan = 0;

        if( ranTestHoge ) ++nRan;
        if( ranHogeTest ) ++nRan;
        if( ranFooBar ) ++nRan;
        if( ranFooBaz ) ++nRan;
        if( ranFooBarTest ) ++nRan;
        if( ranFooQux ) ++nRan;

#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x07)
        IUTEST_EXPECT_EQ( nRan, ::iutest::UnitTest::GetInstance()->reportable_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_disabled_test_count() );
#endif
#if !defined(IUTEST_USE_GTEST)
        const int kTotal = 6;
        IUTEST_EXPECT_EQ( kTotal-nRan, ::iutest::UnitTest::GetInstance()->skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count() );
#endif
    }
    return ::iutest::UnitTest::GetInstance()->Passed();
}